

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

BOOL check_define_prop_flags(int prop_flags,int flags)

{
  bool bVar1;
  bool bVar2;
  BOOL is_getset;
  BOOL has_accessor;
  int flags_local;
  int prop_flags_local;
  
  if ((prop_flags & 1U) == 0) {
    if ((flags & 0x101U) == 0x101) {
      return 0;
    }
    if (((flags & 0x400U) != 0) && ((flags & 4U) != (prop_flags & 4U))) {
      return 0;
    }
  }
  if (((flags & 0x3a00U) != 0) && ((prop_flags & 1U) == 0)) {
    bVar1 = (flags & 0x1800U) != 0;
    bVar2 = (prop_flags & 0x30U) == 0x10;
    if (bVar1 != bVar2) {
      return 0;
    }
    if ((((!bVar1) && (!bVar2)) && ((prop_flags & 2U) == 0)) && ((flags & 0x202U) == 0x202)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static BOOL check_define_prop_flags(int prop_flags, int flags)
{
    BOOL has_accessor, is_getset;

    if (!(prop_flags & JS_PROP_CONFIGURABLE)) {
        if ((flags & (JS_PROP_HAS_CONFIGURABLE | JS_PROP_CONFIGURABLE)) ==
            (JS_PROP_HAS_CONFIGURABLE | JS_PROP_CONFIGURABLE)) {
            return FALSE;
        }
        if ((flags & JS_PROP_HAS_ENUMERABLE) &&
            (flags & JS_PROP_ENUMERABLE) != (prop_flags & JS_PROP_ENUMERABLE))
            return FALSE;
    }
    if (flags & (JS_PROP_HAS_VALUE | JS_PROP_HAS_WRITABLE |
                 JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
        if (!(prop_flags & JS_PROP_CONFIGURABLE)) {
            has_accessor = ((flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) != 0);
            is_getset = ((prop_flags & JS_PROP_TMASK) == JS_PROP_GETSET);
            if (has_accessor != is_getset)
                return FALSE;
            if (!has_accessor && !is_getset && !(prop_flags & JS_PROP_WRITABLE)) {
                /* not writable: cannot set the writable bit */
                if ((flags & (JS_PROP_HAS_WRITABLE | JS_PROP_WRITABLE)) ==
                    (JS_PROP_HAS_WRITABLE | JS_PROP_WRITABLE))
                    return FALSE;
            }
        }
    }
    return TRUE;
}